

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-2.c
# Opt level: O3

int feederBig(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
LAB_0010252a:
    iVar1 = -1;
  }
  else {
    fprintf(__stream,"%d\n",2);
    fwrite("2000000\n",8,1,__stream);
    uVar4 = 0;
    do {
      iVar1 = fprintf(__stream,"%d ",uVar4);
      if (iVar1 < 0) {
        puts("can\'t create in.txt. No space on disk?");
        fclose(__stream);
        goto LAB_0010252a;
      }
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != 2000000);
    fputc(10,__stream);
    fclose(__stream);
    sVar2 = GetLabPointerSize();
    LabMemoryLimit = sVar2 * 40000000 + 0x9c96800;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    int T = 2;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", T);
    fprintf(in, "2000000\n");
    for (i = 0; i < 2000000; i++) {
        if (fprintf(in, "%d ", i) < 0) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "\n");
    fclose(in);
    LabMemoryLimit = 20000000*((sizeof(int)+T-2)/(T-1)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
    return 0;
}